

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_vec_dot_f16_unroll(int n,int xs,float *s,void *xv,ggml_fp16_t *y)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  undefined1 auVar5 [32];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int i;
  long lVar19;
  undefined1 *puVar20;
  int j;
  long lVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  int k;
  long lVar24;
  undefined1 (*pauVar25) [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  ggml_float sumf [2];
  ggml_fp16_t *x [2];
  double local_180 [2];
  void *local_170;
  long local_168;
  undefined1 local_160 [4];
  float afStack_15c [7];
  undefined1 local_140 [32];
  undefined1 local_120 [4];
  float afStack_11c [7];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_180[0] = 0.0;
  local_180[1] = 0.0;
  local_170 = xv;
  local_168 = (long)xs + (long)xv;
  lVar19 = (long)(int)(n & 0xffffffe0);
  local_80 = ZEXT432(0) << 0x40;
  local_a0 = ZEXT432(0) << 0x40;
  local_c0 = ZEXT432(0) << 0x40;
  local_e0 = local_c0;
  local_100 = local_c0;
  _local_120 = local_c0;
  local_140 = ZEXT432(0) << 0x40;
  _local_160 = ZEXT432(0) << 0x40;
  for (lVar22 = 0; lVar22 < lVar19; lVar22 = lVar22 + 0x20) {
    pauVar23 = (undefined1 (*) [32])local_160;
    for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
      auVar26 = vcvtph2ps_f16c(*(undefined1 (*) [16])(y + lVar22 + lVar21 * 8));
      pauVar25 = pauVar23;
      for (lVar24 = 0; lVar24 != 2; lVar24 = lVar24 + 1) {
        auVar5 = vcvtph2ps_f16c(*(undefined1 (*) [16])
                                 ((long)(&local_170)[lVar24] + lVar21 * 0x10 + lVar22 * 2));
        auVar27 = vfmadd213ps_fma(auVar5,auVar26,*pauVar25);
        *pauVar25 = ZEXT1632(auVar27);
        pauVar25 = pauVar25 + 4;
      }
      pauVar23 = pauVar23 + 1;
    }
  }
  puVar20 = local_160;
  for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
    for (lVar21 = 0; lVar21 != 0x80; lVar21 = lVar21 + 0x40) {
      pfVar1 = (float *)(puVar20 + lVar21);
      fVar4 = pfVar1[1];
      fVar6 = pfVar1[2];
      fVar7 = pfVar1[3];
      fVar8 = pfVar1[4];
      fVar9 = pfVar1[5];
      fVar10 = pfVar1[6];
      fVar11 = pfVar1[7];
      pfVar3 = (float *)(puVar20 + lVar21 + 0x20);
      fVar12 = pfVar3[1];
      fVar13 = pfVar3[2];
      fVar14 = pfVar3[3];
      fVar15 = pfVar3[4];
      fVar16 = pfVar3[5];
      fVar17 = pfVar3[6];
      fVar18 = pfVar3[7];
      pfVar2 = (float *)(puVar20 + lVar21);
      *pfVar2 = *pfVar1 + *pfVar3;
      pfVar2[1] = fVar4 + fVar12;
      pfVar2[2] = fVar6 + fVar13;
      pfVar2[3] = fVar7 + fVar14;
      pfVar2[4] = fVar8 + fVar15;
      pfVar2[5] = fVar9 + fVar16;
      pfVar2[6] = fVar10 + fVar17;
      pfVar2[7] = fVar11 + fVar18;
    }
    lVar21 = lVar22 * 0x80;
    auVar26._0_4_ = *(float *)(local_160 + lVar21) + *(float *)(local_120 + lVar21);
    auVar26._4_4_ = *(float *)(local_160 + lVar21 + 4) + *(float *)(local_120 + lVar21 + 4);
    auVar26._8_4_ = *(float *)(local_160 + lVar21 + 8) + *(float *)(local_120 + lVar21 + 8);
    auVar26._12_4_ = *(float *)(local_160 + lVar21 + 0xc) + *(float *)(local_120 + lVar21 + 0xc);
    auVar26._16_4_ = *(float *)(local_160 + lVar21 + 0x10) + *(float *)(local_120 + lVar21 + 0x10);
    auVar26._20_4_ = *(float *)(local_140 + lVar21 + -0xc) + *(float *)(local_100 + lVar21 + -0xc);
    auVar26._24_4_ = *(float *)(local_140 + lVar21 + -8) + *(float *)(local_100 + lVar21 + -8);
    auVar26._28_4_ = *(float *)(local_140 + lVar21 + -4) + *(float *)(local_100 + lVar21 + -4);
    auVar27._0_4_ = auVar26._0_4_ + auVar26._16_4_;
    auVar27._4_4_ = auVar26._4_4_ + auVar26._20_4_;
    auVar27._8_4_ = auVar26._8_4_ + auVar26._24_4_;
    auVar27._12_4_ = auVar26._12_4_ + auVar26._28_4_;
    auVar27 = vhaddps_avx(auVar27,auVar27);
    *(undefined1 (*) [32])(local_160 + lVar21) = auVar26;
    auVar27 = vhaddps_avx(auVar27,auVar27);
    local_180[lVar22] = (double)auVar27._0_4_;
    puVar20 = puVar20 + 0x80;
  }
  for (; lVar19 < n; lVar19 = lVar19 + 1) {
    fVar4 = table_f32_f16[y[lVar19]];
    for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
      local_180[lVar22] =
           (double)(fVar4 * table_f32_f16[*(ushort *)((long)(&local_170)[lVar22] + lVar19 * 2)]) +
           local_180[lVar22];
    }
  }
  for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
    s[lVar19] = (float)local_180[lVar19];
  }
  return;
}

Assistant:

inline static void ggml_vec_dot_f16_unroll(const int n, const int xs, float * restrict s, void * restrict xv, ggml_fp16_t * restrict y) {
    ggml_float sumf[GGML_VEC_DOT_UNROLL] = { 0.0 };

    ggml_fp16_t * restrict x[GGML_VEC_DOT_UNROLL];

    for (int i = 0; i < GGML_VEC_DOT_UNROLL; ++i) {
        x[i] = (ggml_fp16_t *) ((char *) xv + i*xs);
    }

#if defined(GGML_SIMD)
    const int np = (n & ~(GGML_F16_STEP - 1));

    GGML_F16_VEC sum[GGML_VEC_DOT_UNROLL][GGML_F16_ARR] = { { GGML_F16_VEC_ZERO } };

    GGML_F16_VEC ax[GGML_F16_ARR];
    GGML_F16_VEC ay[GGML_F16_ARR];

    for (int i = 0; i < np; i += GGML_F16_STEP) {
        for (int j = 0; j < GGML_F16_ARR; j++) {
            ay[j] = GGML_F16_VEC_LOAD(y + i + j*GGML_F16_EPR, j);

            for (int k = 0; k < GGML_VEC_DOT_UNROLL; ++k) {
                ax[j] = GGML_F16_VEC_LOAD(x[k] + i + j*GGML_F16_EPR, j);

                sum[k][j] = GGML_F16_VEC_FMA(sum[k][j], ax[j], ay[j]);
            }
        }
    }

    // reduce sum0..sum3 to sum0
    for (int k = 0; k < GGML_VEC_DOT_UNROLL; ++k) {
        GGML_F16_VEC_REDUCE(sumf[k], sum[k]);
    }

    // leftovers
    for (int i = np; i < n; ++i) {
        for (int j = 0; j < GGML_VEC_DOT_UNROLL; ++j) {
            sumf[j] += GGML_FP16_TO_FP32(x[j][i])*GGML_FP16_TO_FP32(y[i]);
        }
    }
#else
    for (int i = 0; i < n; ++i) {
        for (int j = 0; j < GGML_VEC_DOT_UNROLL; ++j) {
            sumf[j] += GGML_FP16_TO_FP32(x[j][i])*GGML_FP16_TO_FP32(y[i]);
        }
    }
#endif

    for (int i = 0; i < GGML_VEC_DOT_UNROLL; ++i) {
        s[i] = sumf[i];
    }
}